

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

int Pdr_InvUsedFlopNum(Vec_Int_t *vInv)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int nZeros;
  Vec_Int_t *vCounts;
  Vec_Int_t *vInv_local;
  
  p = Pdr_InvCounts(vInv);
  iVar1 = Vec_IntCountZero(p);
  Vec_IntFree(p);
  iVar2 = Vec_IntEntryLast(vInv);
  return iVar2 - iVar1;
}

Assistant:

int Pdr_InvUsedFlopNum( Vec_Int_t * vInv )
{
    Vec_Int_t * vCounts = Pdr_InvCounts( vInv );
    int nZeros = Vec_IntCountZero( vCounts );
    Vec_IntFree( vCounts );
    return Vec_IntEntryLast(vInv) - nZeros;
}